

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

leb_NodeAndNeighbors *
leb_DecodeNodeAndNeighbors
          (leb_NodeAndNeighbors *__return_storage_ptr__,leb_Heap *leb,uint32_t threadID)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  leb_Node lVar4;
  int iVar5;
  long lVar6;
  leb_SameDepthNeighborIDs nodeIDs;
  
  lVar6 = 0;
  iVar5 = 0;
  nodeIDs = (leb_SameDepthNeighborIDs)(ZEXT816(0x100000000) << 0x40);
  while( true ) {
    uVar2 = leb__HeapRead(leb,(leb_Node)(lVar6 + (nodeIDs._8_8_ >> 0x20)));
    if (uVar2 < 2) break;
    lVar6 = lVar6 + 0x100000000;
    uVar3 = leb__HeapRead(leb,(leb_Node)((ulong)(nodeIDs._reserved * 2) + lVar6));
    uVar2 = uVar3;
    if (uVar3 > threadID) {
      uVar2 = 0;
    }
    nodeIDs = leb__SplitNodeIDs(nodeIDs,(uint)(uVar3 <= threadID));
    threadID = threadID - uVar2;
    iVar5 = iVar5 + 1;
  }
  (__return_storage_ptr__->left).id = nodeIDs.left;
  (__return_storage_ptr__->left).depth = iVar5;
  (__return_storage_ptr__->right).id = nodeIDs.right;
  (__return_storage_ptr__->right).depth = iVar5;
  (__return_storage_ptr__->edge).id = nodeIDs.edge;
  (__return_storage_ptr__->edge).depth = iVar5;
  (__return_storage_ptr__->node).id = nodeIDs._reserved;
  (__return_storage_ptr__->node).depth = iVar5;
  lVar4 = __return_storage_ptr__->edge;
  bVar1 = leb_IsLeafNode(leb,lVar4);
  if (!bVar1) {
    lVar4 = leb_ParentNode(lVar4);
    __return_storage_ptr__->edge = lVar4;
  }
  lVar4 = __return_storage_ptr__->left;
  bVar1 = leb_IsLeafNode(leb,lVar4);
  if (!bVar1) {
    lVar4 = leb__RightChildNode(lVar4);
    __return_storage_ptr__->left = lVar4;
  }
  lVar4 = __return_storage_ptr__->right;
  bVar1 = leb_IsLeafNode(leb,lVar4);
  if (!bVar1) {
    lVar4 = leb__LeftChildNode(lVar4);
    __return_storage_ptr__->right = lVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

LEBDEF leb_NodeAndNeighbors
leb_DecodeNodeAndNeighbors(const leb_Heap *leb, uint32_t threadID)
{
#define nodeID nodeIDs._reserved
    leb_SameDepthNeighborIDs nodeIDs = {0u, 0u, 0u, 1u};
    int32_t nodeDepth = 0;

    while (leb__HeapRead(leb, {nodeID, nodeDepth}) > 1u) {
        uint32_t cmp = leb__HeapRead(leb, {nodeID << 1u, ++nodeDepth});
        uint32_t b = threadID < cmp ? 0u : 1u;

        nodeIDs = leb__SplitNodeIDs(nodeIDs, b);
        threadID-= cmp * b;
    }

    return leb__NodeAndNeighborsFromSameDepthNeighborIDs(leb, nodeIDs, nodeDepth);
#undef nodeID
}